

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  ptls_aead_algorithm_t *aead;
  ptls_hash_algorithm_t *hash;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  size_t sVar5;
  ptls_aead_context_t *ctx;
  ptls_aead_context_t *ctx_00;
  void *__s;
  byte *__ptr;
  uint8_t *puVar6;
  size_t sVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  size_t sVar14;
  size_t i_1;
  long lVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long local_2338;
  uint64_t local_2308 [5];
  char *local_22e0;
  char *local_22d8;
  ulong local_22d0;
  uint64_t local_22c8;
  uint64_t local_22c0;
  uint64_t local_22b8;
  long local_22b0;
  uint8_t secret [32];
  char HW [128];
  char OS [128];
  char local_2188 [138];
  utsname uts;
  uint8_t *v_enc [1000];
  
  iVar16 = 10000000;
  uVar3 = bench_time();
  uVar2 = 0xdeadbeef;
  uVar13 = 0;
  while (uVar11 = uVar2, bVar17 = iVar16 != 0, iVar16 = iVar16 + -1, bVar17) {
    uVar2 = (uVar11 << 0x1d | uVar11 >> 3) + uVar11 ^ uVar13;
    uVar13 = uVar11;
  }
  uVar4 = bench_time();
  OS[0] = '\0';
  HW[0] = '\0';
  iVar16 = uname((utsname *)&uts);
  if (iVar16 == 0) {
    sVar5 = strlen(uts.sysname);
    if (sVar5 + 1 < 0x80) {
      strcpy(OS,uts.sysname);
    }
    sVar5 = strlen(uts.machine);
    if (sVar5 + 1 < 0x80) {
      strcpy(HW,uts.machine);
    }
  }
  if (argc == 2) {
    pcVar1 = argv[1];
    if (((*pcVar1 == '-') && (pcVar1[1] == 'f')) && (pcVar1[2] == '\0')) {
LAB_00108bd1:
      local_2308[4] = CONCAT44(uVar13,uVar11);
      puts(
          "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,"
          );
      lVar12 = 0;
      iVar16 = 0;
      uVar9 = 0;
      do {
        sVar14 = (size_t)(uint)argc;
        if ((iVar16 != 0) || (7 < uVar9)) {
          if (lVar12 == 0) {
            printf("Unexpected value of test sum s = %llx\n",0);
          }
          return iVar16;
        }
        if ((argc == 2) || (iVar16 = 0, aead_list[uVar9].enabled_by_defaut != 0)) {
          local_22d8 = aead_list[uVar9].provider;
          local_22e0 = aead_list[uVar9].algo_name;
          aead = aead_list[uVar9].aead;
          hash = aead_list[uVar9].hash;
          local_2188[0] = '\0';
          local_22d0 = uVar9;
          iVar16 = strcmp(local_22d8,"openssl");
          if (iVar16 == 0) {
            sprintf(local_2188,"%d.%d.%d%c",3,0,0,0x62);
          }
          builtin_memcpy(secret + 0x10,"zzzzzzzzzzzzzzzz",0x10);
          builtin_memcpy(secret,"zzzzzzzzzzzzzzzz",0x10);
          ctx = ptls_aead_new(aead,hash,1,secret,(char *)0x0);
          ctx_00 = ptls_aead_new(aead,hash,0,secret,(char *)0x0);
          if (ctx_00 == (ptls_aead_context_t *)0x0 || ctx == (ptls_aead_context_t *)0x0) {
            lVar12 = lVar12 + local_2308[4];
            iVar16 = 0x201;
          }
          else {
            memset(v_enc,0,8000);
            local_2308[0] = 0;
            local_2308[1] = 0;
            local_2308[2] = 0;
            local_2308[3] = 0;
            __s = malloc(0x5dc);
            __ptr = (byte *)malloc(0x5dc);
            iVar16 = 0;
            if (__ptr == (byte *)0x0) {
              iVar16 = 0x201;
            }
            if (__s == (void *)0x0) {
              iVar16 = 0x201;
            }
            for (uVar9 = 0; (iVar16 == 0 && (uVar9 < 1000)); uVar9 = uVar9 + 1) {
              puVar6 = (uint8_t *)malloc(0x61c);
              v_enc[uVar9] = puVar6;
              iVar16 = 0x201;
              if (puVar6 != (uint8_t *)0x0) {
                iVar16 = 0;
              }
            }
            lVar12 = 0;
            if (iVar16 == 0) {
              memset(__s,0,0x5dc);
              lVar10 = 1000;
              bVar17 = true;
              lVar15 = 0;
              local_2338 = 0;
              iVar16 = 0;
              while (bVar17) {
                local_22c8 = local_2308[0];
                local_22b0 = lVar15;
                local_22b8 = bench_time();
                for (lVar15 = 0; lVar10 != lVar15; lVar15 = lVar15 + 1) {
                  local_2308[0] = local_2308[0] + 1;
                  puVar6 = v_enc[lVar15];
                  (*ctx->do_encrypt)(ctx,puVar6,__s,0x5dc,local_2308[0],local_2308,0x20,
                                     (ptls_aead_supplementary_encryption_t *)0x0);
                  sVar14 = ctx->algo->tag_size + 0x5dc;
                  lVar12 = lVar12 + (ulong)puVar6[0x5dc];
                }
                local_22c0 = bench_time();
                local_2308[0] = local_22c8;
                for (lVar15 = 0; lVar10 != lVar15; lVar15 = lVar15 + 1) {
                  local_2308[0] = local_2308[0] + 1;
                  sVar7 = (*ctx_00->do_decrypt)
                                    (ctx_00,__ptr,v_enc[lVar15],sVar14,local_2308[0],local_2308,0x20
                                    );
                  if (sVar7 != 0x5dc) {
                    iVar16 = 0x33;
                    break;
                  }
                  lVar12 = lVar12 + (ulong)*__ptr;
                }
                uVar8 = bench_time();
                lVar15 = (local_22b0 - local_22b8) + local_22c0;
                local_2338 = (local_2338 - local_22c0) + uVar8;
                bVar17 = false;
                lVar10 = 0;
              }
            }
            else {
              lVar15 = 0;
              local_2338 = 0;
            }
            free(__s);
            for (lVar10 = 0; lVar10 != 1000; lVar10 = lVar10 + 1) {
              free(v_enc[lVar10]);
            }
            free(__ptr);
            if (iVar16 == 0) {
              auVar18._8_4_ = (int)((ulong)lVar15 >> 0x20);
              auVar18._0_8_ = lVar15;
              auVar18._12_4_ = 0x45300000;
              auVar19._8_4_ = (int)((ulong)local_2338 >> 0x20);
              auVar19._0_8_ = local_2338;
              auVar19._12_4_ = 0x45300000;
              printf("%s, %s, %d, %s, %d, %s, %s, %s, %d, %d, %d, %d, %.2f, %.2f\n",
                     12000000.0 /
                     ((auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)),
                     12000000.0 /
                     ((auVar19._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_2338) - 4503599627370496.0)),OS,HW,0x40
                     ,"release",(ulong)(uint)((int)uVar4 - (int)uVar3),local_22d8,local_2188,
                     local_22e0,1000,0x5dc,lVar15,local_2338);
              iVar16 = 0;
            }
          }
          if (ctx != (ptls_aead_context_t *)0x0) {
            ptls_aead_free(ctx);
          }
          uVar9 = local_22d0;
          if (ctx_00 != (ptls_aead_context_t *)0x0) {
            ptls_aead_free(ctx_00);
            uVar9 = local_22d0;
          }
        }
        uVar9 = uVar9 + 1;
      } while( true );
    }
  }
  else if (argc < 2) goto LAB_00108bd1;
  fprintf(_stderr,"Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n",
          *argv);
  exit(-1);
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;
    int force_all_tests = 0;
    uint64_t x = 0xdeadbeef;
    uint64_t s = 0;
    int basic_ref = bench_basic(&x);
    char OS[128];
    char HW[128];
#ifndef _WINDOWS
    struct utsname uts;
#endif

#ifdef _WINDOWS
    (void)strcpy_s(OS, sizeof(OS), "windows");
    (void)strcpy_s(HW, sizeof(HW), "x86_64");
#else
    OS[0] = 0;
    HW[0] = 0;
    if (uname(&uts) == 0) {
        if (strlen(uts.sysname) + 1 < sizeof(OS)) {
            strcpy(OS, uts.sysname);
        }
        if (strlen(uts.machine) + 1 < sizeof(HW)) {
            strcpy(HW, uts.machine);
        }
    }
#endif

#ifdef PTLS_HAVE_MBEDTLS
    if (psa_crypto_init() != PSA_SUCCESS) {
        fprintf(stderr, "psa_crypto_init fails.\n");
        exit(-1);
    }
#endif

    if (argc == 2 && strcmp(argv[1], "-f") == 0) {
        force_all_tests = 1;
    } else if (argc > 1) {
        fprintf(stderr, "Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n", argv[0]);
        exit(-1);
    }

    printf(
        "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,\n");

    for (size_t i = 0; ret == 0 && i < nb_aead_list; i++) {
        if (aead_list[i].enabled_by_defaut || force_all_tests) {
            ret = bench_run_aead(OS, HW, basic_ref, x, aead_list[i].provider, aead_list[i].algo_name, aead_list[i].aead,
                                 aead_list[i].hash, 1000, 1500, &s);
        }
    }

    /* Gratuitous test, designed to ensure that the initial computation
     * of the basic reference benchmark is not optimized away. */
    if (s == 0) {
        printf("Unexpected value of test sum s = %llx\n", (unsigned long long)s);
    }

#ifdef PTLS_HAVE_MBEDTLS
    /* Deinitialize the PSA crypto library. */
    mbedtls_psa_crypto_free();
#endif

    return ret;
}